

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
write_int_noinline<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned__int128>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,
          write_int_arg<unsigned___int128> arg,basic_format_specs<wchar_t> *specs,locale_ref loc)

{
  presentation_type pVar1;
  undefined1 value [16];
  undefined1 n [16];
  undefined1 n_00 [16];
  undefined1 n_01 [16];
  undefined1 n_02 [16];
  bool bVar2;
  int iVar3;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar4;
  uint uVar5;
  uint uVar6;
  undefined8 in_stack_ffffffffffffff48;
  undefined5 in_stack_ffffffffffffff50;
  undefined5 uVar7;
  undefined3 in_stack_ffffffffffffff55;
  undefined3 uVar8;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_90;
  write_int_data<wchar_t> data;
  undefined1 local_78 [40];
  undefined5 uStack_50;
  undefined3 uStack_4b;
  int iStack_48;
  bool bStack_44;
  
  pVar1 = specs->type;
  uVar8 = arg.abs_value._13_3_;
  uVar7 = arg.abs_value._8_5_;
  local_90.container = out.container;
  switch(pVar1) {
  case none:
  case dec:
    if (((specs->field_0xa & 1) == 0) ||
       (value._8_5_ = in_stack_ffffffffffffff50, value._0_8_ = in_stack_ffffffffffffff48,
       value._13_3_ = in_stack_ffffffffffffff55,
       bVar2 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned__int128,wchar_t>
                         ((detail *)&local_90,
                          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> *)
                          (detail *)arg.abs_value,(unsigned___int128)value,arg.abs_value._8_4_,
                          (basic_format_specs<wchar_t> *)(ulong)arg.prefix,(locale_ref)specs),
       !bVar2)) {
      n_01._8_5_ = in_stack_ffffffffffffff50;
      n_01._0_8_ = in_stack_ffffffffffffff48;
      n_01._13_3_ = in_stack_ffffffffffffff55;
      iVar3 = count_digits_fallback<unsigned__int128>
                        ((detail *)arg.abs_value,(unsigned___int128)n_01);
      bVar4.container = local_90.container;
      if (specs->precision == -1 && specs->width == 0) {
        to_unsigned<int>(iVar3);
        if (arg.prefix != 0) {
          for (uVar6 = arg.prefix & 0xffffff; uVar6 != 0; uVar6 = uVar6 >> 8) {
            local_78._0_4_ = uVar6 & 0xff;
            buffer<wchar_t>::push_back(bVar4.container,(wchar_t *)local_78);
          }
        }
        local_90 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1589:41)>
                   ::anon_class_64_3_4ecd7a16::anon_class_32_2_ddb8d65b_for_write_digits::operator()
                             ((anon_class_32_2_ddb8d65b_for_write_digits *)&stack0xffffffffffffff48,
                              bVar4.container);
      }
      else {
        write_int_data<wchar_t>::write_int_data(&data,iVar3,arg.prefix,specs);
        local_78._0_4_ = arg.prefix;
        local_78._8_8_ = data.size;
        local_78._16_8_ = data.padding;
        local_78._32_8_ = (detail *)arg.abs_value;
        uStack_50 = uVar7;
        uStack_4b = uVar8;
        iStack_48 = iVar3;
        local_90 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,unsigned_int,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>
                             (bVar4,specs,data.size,(anon_class_64_3_4ecd7a16 *)local_78);
      }
    }
    break;
  case oct:
    n_02._8_5_ = in_stack_ffffffffffffff50;
    n_02._0_8_ = in_stack_ffffffffffffff48;
    n_02._13_3_ = in_stack_ffffffffffffff55;
    iVar3 = count_digits<3,unsigned__int128>((unsigned___int128)n_02);
    if (((specs->field_0x9 & 0x80) != 0) &&
       (((detail *)arg.abs_value != (detail *)0x0 || arg.abs_value._8_8_ != 0) &&
        specs->precision <= iVar3)) {
      uVar6 = 0x3000;
      if (arg.prefix == 0) {
        uVar6 = 0x30;
      }
      arg.prefix = (uVar6 | arg.prefix) + L'\x01000000';
    }
    if (specs->precision == -1 && specs->width == 0) {
      to_unsigned<int>(iVar3);
      if (arg.prefix != L'\0') {
        for (uVar6 = arg.prefix & 0xffffff; uVar6 != 0; uVar6 = uVar6 >> 8) {
          local_78._0_4_ = uVar6 & 0xff;
          buffer<wchar_t>::push_back(out.container,(wchar_t *)local_78);
        }
      }
      local_90 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1622:22)>
                 ::anon_class_64_3_4ecd7a16::anon_class_32_2_ddb8d65b_for_write_digits::operator()
                           ((anon_class_32_2_ddb8d65b_for_write_digits *)&stack0xffffffffffffff48,
                            out.container);
    }
    else {
      write_int_data<wchar_t>::write_int_data(&data,iVar3,arg.prefix,specs);
      local_78._8_8_ = data.size;
      local_78._16_8_ = data.padding;
      local_78._0_4_ = arg.prefix;
      local_78._32_8_ = (detail *)arg.abs_value;
      uStack_50 = uVar7;
      uStack_4b = uVar8;
      iStack_48 = iVar3;
      local_90 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_4_>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,unsigned_int,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_4_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>
                           (out,specs,data.size,(anon_class_64_3_4ecd7a16 *)local_78);
    }
    break;
  case hex_lower:
  case hex_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar5 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar6 = uVar5 << 8;
      if (arg.prefix == 0) {
        uVar6 = uVar5;
      }
      arg.prefix = (uVar6 | arg.prefix) + L'\x02000000';
    }
    n_00._8_5_ = in_stack_ffffffffffffff50;
    n_00._0_8_ = in_stack_ffffffffffffff48;
    n_00._13_3_ = in_stack_ffffffffffffff55;
    iVar3 = count_digits<4,unsigned__int128>((unsigned___int128)n_00);
    if (specs->precision == -1 && specs->width == 0) {
      to_unsigned<int>(iVar3);
      if (arg.prefix != L'\0') {
        for (uVar6 = arg.prefix & 0xffffff; uVar6 != 0; uVar6 = uVar6 >> 8) {
          local_78._0_4_ = uVar6 & 0xff;
          buffer<wchar_t>::push_back(out.container,(wchar_t *)local_78);
        }
      }
      local_90 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1600:41)>
                 ::anon_class_64_3_4ecd7a16::anon_class_32_3_bd9b568b_for_write_digits::operator()
                           ((anon_class_32_3_bd9b568b_for_write_digits *)&stack0xffffffffffffff48,
                            out.container);
    }
    else {
      write_int_data<wchar_t>::write_int_data(&data,iVar3,arg.prefix,specs);
      local_78._8_8_ = data.size;
      local_78._16_8_ = data.padding;
      local_78._0_4_ = arg.prefix;
      local_78._32_8_ = (detail *)arg.abs_value;
      uStack_50 = uVar7;
      uStack_4b = uVar8;
      iStack_48 = iVar3;
      bStack_44 = pVar1 == hex_upper;
      local_90 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_2_>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,unsigned_int,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_2_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>
                           (out,specs,data.size,(anon_class_64_3_4ecd7a16 *)local_78);
    }
    break;
  case bin_lower:
  case bin_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar5 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar6 = uVar5 << 8;
      if (arg.prefix == 0) {
        uVar6 = uVar5;
      }
      arg.prefix = (uVar6 | arg.prefix) + L'\x02000000';
    }
    n._8_5_ = in_stack_ffffffffffffff50;
    n._0_8_ = in_stack_ffffffffffffff48;
    n._13_3_ = in_stack_ffffffffffffff55;
    iVar3 = count_digits<1,unsigned__int128>((unsigned___int128)n);
    if (specs->precision == -1 && specs->width == 0) {
      to_unsigned<int>(iVar3);
      if (arg.prefix != L'\0') {
        for (uVar6 = arg.prefix & 0xffffff; uVar6 != 0; uVar6 = uVar6 >> 8) {
          local_78._0_4_ = uVar6 & 0xff;
          buffer<wchar_t>::push_back(out.container,(wchar_t *)local_78);
        }
      }
      local_90 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1611:22)>
                 ::anon_class_64_3_4ecd7a16::anon_class_32_2_ddb8d65b_for_write_digits::operator()
                           ((anon_class_32_2_ddb8d65b_for_write_digits *)&stack0xffffffffffffff48,
                            out.container);
    }
    else {
      write_int_data<wchar_t>::write_int_data(&data,iVar3,arg.prefix,specs);
      local_78._8_8_ = data.size;
      local_78._16_8_ = data.padding;
      local_78._0_4_ = arg.prefix;
      local_78._32_8_ = (detail *)arg.abs_value;
      uStack_50 = uVar7;
      uStack_4b = uVar8;
      iStack_48 = iVar3;
      local_90 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_3_>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,unsigned_int,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_3_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>
                           (out,specs,data.size,(anon_class_64_3_4ecd7a16 *)local_78);
    }
    break;
  default:
    fmt::v8::detail::throw_format_error("invalid type specifier");
  case chr:
    bVar4 = write_char<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                      (out,(wchar_t)arg.abs_value,specs);
    return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar4.container;
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)local_90.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}